

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListWindow.cpp
# Opt level: O2

void __thiscall cursespp::ListWindow::PageUp(ListWindow *this)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  
  (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
    [0x42])();
  (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
    [0x41])(this);
  sVar2 = ScrollableWindow::GetPreviousPageEntryIndex(&this->super_ScrollableWindow);
  lVar3 = (long)((sVar2 << 0x20) + 0x100000000) >> 0x20;
  lVar1 = (long)((sVar2 << 0x20) + 0x200000000) >> 0x20;
  if ((int)sVar2 < 1) {
    lVar3 = 0;
    lVar1 = 0;
  }
  (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
    [0x46])(this,lVar1);
  (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
    [0x44])(this,lVar3);
  return;
}

Assistant:

void ListWindow::PageUp() {
    IScrollAdapter &adapter = this->GetScrollAdapter();
    ScrollPos spos = this->GetScrollPosition();
    int target = (int) this->GetPreviousPageEntryIndex();

    /* if the target position is zero, let it be so the user can see
    the top of the list. otherwise, scroll down by one to give indication
    there is more to see. */
    target = (target > 0) ? target + 1 : 0;

    this->SetSelectedIndex((target == 0) ? 0 : target + 1);
    this->ScrollTo(target);
}